

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CodeBlockProd * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::CodeBlockProd,slang::ast::StatementBlockSymbol_const&>
          (BumpAllocator *this,StatementBlockSymbol *args)

{
  CodeBlockProd *pCVar1;
  
  pCVar1 = (CodeBlockProd *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CodeBlockProd *)this->endPtr < pCVar1 + 1) {
    pCVar1 = (CodeBlockProd *)allocateSlow(this,0x10,8);
  }
  else {
    this->head->current = (byte *)(pCVar1 + 1);
  }
  (pCVar1->super_ProdBase).kind = CodeBlock;
  (pCVar1->block).ptr = args;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }